

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

void __thiscall
Refal2::CProgramPrintHelper::Label(CProgramPrintHelper *this,ostream *outputStream,TLabel label)

{
  bool bVar1;
  ostream *poVar2;
  element_type *this_00;
  CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int labelModuleId;
  TLabel label_local;
  ostream *outputStream_local;
  CProgramPrintHelper *this_local;
  
  bVar1 = CPrintHelper::PrintLabelWithModule(&this->super_CPrintHelper);
  if (bVar1) {
    poVar2 = (ostream *)std::ostream::operator<<(outputStream,label / 0x10000);
    std::operator<<(poVar2,":");
  }
  this_00 = std::__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->program);
  this_01 = &CProgram::Module(this_00,label / 0x10000)->Functions;
  pbVar3 = CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetKey(this_01,label % 0x10000);
  std::operator<<(outputStream,(string *)pbVar3);
  return;
}

Assistant:

void CProgramPrintHelper::Label( std::ostream& outputStream,
	const TLabel label ) const
{
	const int labelModuleId = label / LabelMask;
	if( PrintLabelWithModule() ) {
		outputStream << labelModuleId << ":";
	}
	outputStream << program->Module( labelModuleId ).Functions.
		GetKey(	label % LabelMask );
}